

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

void parseFontName(QString *name,QString *foundry,QString *family)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t cVar5;
  uint uVar6;
  qsizetype qVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  long in_FS_OFFSET;
  QStringView QVar12;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.ptr = (name->d).ptr;
  local_58.d.d = (Data *)(name->d).size;
  qVar7 = QStringView::indexOf((QStringView *)&local_58,(QChar)0x5b,0,CaseSensitive);
  QVar12.m_data = (name->d).ptr;
  QVar12.m_size = (name->d).size;
  uVar6 = QtPrivate::lastIndexOf(QVar12,-1,L']',CaseSensitive);
  uVar9 = (uint)qVar7;
  if (((int)uVar9 < (int)uVar6) && (((uVar6 | uVar9) & 0x80000000) == 0)) {
    QString::mid((longlong)&local_58,(longlong)name);
    pQVar1 = &((foundry->d).d)->super_QArrayData;
    pcVar2 = (foundry->d).ptr;
    (foundry->d).d = local_58.d.d;
    (foundry->d).ptr = local_58.d.ptr;
    qVar3 = (foundry->d).size;
    (foundry->d).size = local_58.d.size;
    local_58.d.d = (Data *)pQVar1;
    local_58.d.ptr = pcVar2;
    local_58.d.size = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    if ((int)uVar9 < 1) {
      uVar8 = 0;
    }
    else {
      uVar6 = (uint)(qVar7 + 0xffffffffU);
      if ((name->d).ptr[qVar7 + 0xffffffffU & 0xffffffff] != L' ') {
        uVar6 = uVar9;
      }
      uVar8 = (ulong)uVar6;
    }
    QString::left(&local_58,name,uVar8);
    pQVar1 = &((family->d).d)->super_QArrayData;
    pcVar2 = (family->d).ptr;
    *(undefined4 *)&(family->d).d = local_58.d.d._0_4_;
    *(undefined4 *)((long)&(family->d).d + 4) = local_58.d.d._4_4_;
    *(undefined4 *)&(family->d).ptr = local_58.d.ptr._0_4_;
    *(undefined4 *)((long)&(family->d).ptr + 4) = local_58.d.ptr._4_4_;
    qVar7 = (family->d).size;
    (family->d).size = local_58.d.size;
    local_58.d.d = (Data *)pQVar1;
    local_58.d.ptr = pcVar2;
    local_58.d.size = qVar7;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  else {
    if ((foundry->d).ptr != (char16_t *)0x0) {
      pQVar1 = &((foundry->d).d)->super_QArrayData;
      (foundry->d).d = (Data *)0x0;
      (foundry->d).ptr = (char16_t *)0x0;
      (foundry->d).size = 0;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
    }
    QString::operator=(family,name);
  }
  pDVar4 = (family->d).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)family,(AllocationOption)(family->d).size);
  }
  iVar11 = (int)(family->d).size;
  if (iVar11 != 0) {
    pcVar2 = (family->d).ptr;
    uVar8 = 1;
    lVar10 = 0;
    do {
      if ((uVar8 & 1) != 0) {
        cVar5 = QChar::toUpper((uint)(ushort)pcVar2[lVar10]);
        pcVar2[lVar10] = cVar5;
      }
      cVar5 = pcVar2[lVar10];
      if ((0x17 < (ushort)((ushort)cVar5 - 9)) ||
         (uVar8 = 1, (0x80001fU >> ((ushort)cVar5 - 9 & 0x1f) & 1) == 0)) {
        if ((ushort)cVar5 < 0x80) {
          uVar8 = 0;
        }
        else {
          uVar8 = 1;
          if ((cVar5 != L'\x85') && ((uint)(ushort)cVar5 != L'\xa0')) {
            uVar8 = QChar::isSpace_helper((uint)(ushort)cVar5);
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (iVar11 != (int)lVar10);
  }
  pDVar4 = (foundry->d).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)foundry,(AllocationOption)(foundry->d).size);
  }
  iVar11 = (int)(foundry->d).size;
  if (iVar11 != 0) {
    pcVar2 = (foundry->d).ptr;
    uVar8 = 1;
    lVar10 = 0;
    do {
      if ((uVar8 & 1) != 0) {
        cVar5 = QChar::toUpper((uint)(ushort)pcVar2[lVar10]);
        pcVar2[lVar10] = cVar5;
      }
      cVar5 = pcVar2[lVar10];
      if ((0x17 < (ushort)((ushort)cVar5 - 9)) ||
         (uVar8 = 1, (0x80001fU >> ((ushort)cVar5 - 9 & 0x1f) & 1) == 0)) {
        if ((ushort)cVar5 < 0x80) {
          uVar8 = 0;
        }
        else {
          uVar8 = 1;
          if ((cVar5 != L'\x85') && ((uint)(ushort)cVar5 != L'\xa0')) {
            uVar8 = QChar::isSpace_helper((uint)(ushort)cVar5);
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (iVar11 != (int)lVar10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parseFontName(const QString &name, QString &foundry, QString &family)
{
    int i = name.indexOf(u'[');
    int li = name.lastIndexOf(u']');
    if (i >= 0 && li >= 0 && i < li) {
        foundry = name.mid(i + 1, li - i - 1);
        if (i > 0 && name[i - 1] == u' ')
            i--;
        family = name.left(i);
    } else {
        foundry.clear();
        family = name;
    }

    // capitalize the family/foundry names
    bool space = true;
    QChar *s = family.data();
    int len = family.size();
    while(len--) {
        if (space) *s = s->toUpper();
        space = s->isSpace();
        ++s;
    }

    space = true;
    s = foundry.data();
    len = foundry.size();
    while(len--) {
        if (space) *s = s->toUpper();
        space = s->isSpace();
        ++s;
    }
}